

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  StkId pSVar1;
  byte bVar2;
  LClosure *o;
  Proto *pPVar3;
  LClosure *x_;
  TValue *io;
  LClosure *cl;
  LoadState S;
  char *name_local;
  ZIO *Z_local;
  lua_State *L_local;
  
  if ((*name == '@') || (*name == '=')) {
    S.Z = (ZIO *)(name + 1);
  }
  else {
    S.Z = (ZIO *)name;
    if (*name == '\x1b') {
      S.Z = (ZIO *)anon_var_dwarf_19618;
    }
  }
  cl = (LClosure *)L;
  S.L = (lua_State *)Z;
  S.name = name;
  checkHeader((LoadState *)&cl);
  bVar2 = loadByte((LoadState *)&cl);
  o = luaF_newLclosure(L,(uint)bVar2);
  pSVar1 = (L->top).p;
  *(LClosure **)pSVar1 = o;
  (pSVar1->val).tt_ = 'F';
  luaD_inctop(L);
  pPVar3 = luaF_newproto(L);
  o->p = pPVar3;
  if (((o->marked & 0x20) != 0) && ((o->p->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(GCObject *)o->p);
  }
  loadFunction((LoadState *)&cl,o->p,(TString *)0x0);
  return o;
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, loadByte(&S));
  setclLvalue2s(L, L->top.p, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  loadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, cl->p);
  return cl;
}